

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Padding_x86_avx512::forward_int8
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  int iVar5;
  undefined1 auVar6 [40];
  undefined1 auVar7 [64];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  undefined8 *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int x;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  undefined8 *puVar25;
  undefined8 *puVar26;
  int z;
  uint uVar27;
  ulong uVar28;
  undefined8 *puVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  bool bVar33;
  undefined1 auVar34 [64];
  Mat m;
  Mat m_1;
  ulong uVar13;
  
  uVar24 = bottom_blob->c;
  uVar10 = (ulong)uVar24;
  m.elemsize = bottom_blob->elemsize;
  m.elempack = bottom_blob->elempack;
  m.dims = bottom_blob->dims;
  m.w = bottom_blob->w;
  m.h = bottom_blob->h;
  iVar8 = bottom_blob->d;
  if (m.elempack == 8) {
    switch(m.dims) {
    case 1:
      uVar12 = (this->super_Padding).left;
      if ((((uVar12 & 7) == 0) &&
          (uVar12 = uVar12 + m.w * 8 + (this->super_Padding).right, (uVar12 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,(int)uVar12 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator)
        ;
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar10 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,0,0,(this->super_Padding).left / 8,
                   (this->super_Padding).right / 8,
                   uVar10 << 0x38 | uVar10 << 0x30 | uVar10 << 0x28 |
                   uVar10 << 0x20 | uVar10 << 0x18 | uVar10 << 0x10 | uVar10 << 8 | uVar10);
        return 0;
      }
      break;
    case 2:
      uVar12 = (this->super_Padding).top;
      if ((((uVar12 & 7) == 0) &&
          (uVar12 = uVar12 + m.h * 8 + (this->super_Padding).bottom, (uVar12 & 7) == 0)) &&
         ((this->super_Padding).type == 0)) {
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    (int)uVar12 >> 3,m.elemsize & 0xfffffffffffffff8,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        uVar10 = (ulong)(this->super_Padding).value;
        padding_constant_pack8_int8_sse
                  (bottom_blob,top_blob,(this->super_Padding).top / 8,
                   (this->super_Padding).bottom / 8,(this->super_Padding).left,
                   (this->super_Padding).right,
                   uVar10 << 0x38 | uVar10 << 0x30 | uVar10 << 0x28 |
                   uVar10 << 0x20 | uVar10 << 0x18 | uVar10 << 0x10 | uVar10 << 8 | uVar10);
        return 0;
      }
      break;
    case 3:
      uVar12 = (this->super_Padding).front;
      uVar27 = uVar12 + uVar24 * 8 + (this->super_Padding).behind;
      bVar33 = (uVar27 & 7) == 0;
      if (bVar33 && (uVar12 & 7) == 0) {
        if ((uVar27 == uVar24 * 8) || ((this->super_Padding).type == 0)) {
          uVar27 = (int)uVar27 >> 3;
          Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                      m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar27,
                      (m.elemsize >> 3) << bVar33 * '\x03',8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          uVar10 = (long)(this->super_Padding).front / -8;
          uVar13 = uVar10 & 0xffffffff;
          if ((int)uVar27 < 1) {
            uVar27 = 0;
          }
          for (uVar30 = 0; auVar34 = (undefined1  [64])m_1._0_64_, uVar30 != uVar27;
              uVar30 = uVar30 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            sVar1 = top_blob->cstep;
            puVar16 = (undefined8 *)(sVar1 * uVar30 * m.elemsize + (long)pvVar3);
            m.elempack = top_blob->elempack;
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.c = top_blob->d;
            m.d = 1;
            m.dims = top_blob->dims + -1;
            m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
            if (top_blob->dims == 4) {
              m.cstep = (long)m.h * (long)m.w;
            }
            uVar9 = (ulong)(this->super_Padding).value;
            uVar9 = uVar9 << 0x38 | uVar9 << 0x30 | uVar9 << 0x28 |
                    uVar9 << 0x20 | uVar9 << 0x18 | uVar9 << 0x10 | uVar9 << 8 | uVar9;
            uVar12 = (int)uVar10 + (int)uVar30;
            if ((int)uVar12 < 0 || (int)uVar24 <= (int)uVar12) {
              uVar12 = top_blob->d * (int)m.cstep;
              if ((int)uVar12 < 1) {
                uVar12 = 0;
              }
              for (uVar28 = 0; uVar12 != uVar28; uVar28 = uVar28 + 1) {
                *(ulong *)((long)pvVar3 + uVar28 * 8 + sVar1 * m.elemsize * uVar30) = uVar9;
              }
            }
            else {
              iVar8 = bottom_blob->w;
              lVar23 = (long)iVar8;
              iVar31 = bottom_blob->h;
              pvVar3 = bottom_blob->data;
              uVar28 = bottom_blob->elemsize;
              sVar1 = bottom_blob->cstep;
              puVar29 = (undefined8 *)(uVar12 * sVar1 * uVar28 + (long)pvVar3);
              m_1.refcount = (int *)0x0;
              m_1.data = puVar29;
              m_1.elemsize = uVar28;
              m_1._28_36_ = auVar34._28_36_;
              m_1.elempack = bottom_blob->elempack;
              auVar7 = (undefined1  [64])m_1._0_64_;
              m_1._40_24_ = auVar34._40_24_;
              m_1._0_32_ = auVar7._0_32_;
              m_1.allocator = bottom_blob->allocator;
              auVar6 = (undefined1  [40])m_1._0_40_;
              m_1.w = iVar8;
              m_1.h = iVar31;
              m_1.d = 1;
              m_1._60_4_ = auVar34._60_4_;
              m_1.c = bottom_blob->d;
              m_1.dims = bottom_blob->dims + -1;
              m_1._0_44_ = CONCAT440(m_1.dims,auVar6);
              m_1.cstep = (uVar28 * iVar31 * lVar23 + 0xf & 0xfffffffffffffff0) / uVar28;
              if (bottom_blob->dims == 4) {
                m_1.cstep = iVar31 * lVar23;
              }
              iVar20 = (this->super_Padding).type;
              if (iVar20 == 0) {
                m.data = puVar16;
                padding_constant_pack8_int8_sse
                          (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                           (this->super_Padding).left,(this->super_Padding).right,uVar9);
                iVar20 = (this->super_Padding).type;
              }
              if (iVar20 == 2) {
                iVar20 = (this->super_Padding).top;
                uVar12 = (this->super_Padding).left;
                lVar21 = (long)(int)uVar12;
                uVar14 = 0;
                uVar9 = 0;
                if (0 < (int)uVar12) {
                  uVar9 = (ulong)uVar12;
                }
                iVar17 = 0;
                if (0 < iVar8) {
                  iVar17 = iVar8;
                }
                uVar12 = (this->super_Padding).right;
                uVar15 = (ulong)uVar12;
                if ((int)uVar12 < 1) {
                  uVar15 = uVar14;
                }
                iVar18 = iVar20;
                if (iVar20 < 1) {
                  iVar18 = 0;
                }
                puVar29 = puVar29 + iVar20 * iVar8;
                iVar11 = (this->super_Padding).bottom;
                lVar32 = (long)pvVar3 +
                         sVar1 * uVar28 * uVar13 + lVar21 * 8 + (long)(iVar20 * iVar8) * 8;
                for (; (int)uVar14 != iVar18; uVar14 = (ulong)((int)uVar14 + 1)) {
                  for (lVar22 = 0; -lVar22 != uVar9; lVar22 = lVar22 + -1) {
                    *puVar16 = *(undefined8 *)(lVar32 + lVar22 * 8);
                    puVar16 = puVar16 + 1;
                  }
                  puVar26 = puVar29;
                  for (iVar20 = 0; iVar20 != iVar17; iVar20 = iVar20 + 1) {
                    uVar2 = *puVar26;
                    puVar26 = puVar26 + 1;
                    *puVar16 = uVar2;
                    puVar16 = puVar16 + 1;
                  }
                  for (lVar22 = 0; -lVar22 != uVar15; lVar22 = lVar22 + -1) {
                    *puVar16 = puVar26[lVar22 + -2];
                    puVar16 = puVar16 + 1;
                  }
                  puVar29 = puVar29 + -lVar23;
                  lVar32 = lVar32 + lVar23 * -8;
                }
                iVar18 = 0;
                iVar20 = 0;
                if (0 < iVar31) {
                  iVar20 = iVar31;
                }
                for (; iVar18 != iVar20; iVar18 = iVar18 + 1) {
                  for (lVar32 = 0; -lVar32 != uVar9; lVar32 = lVar32 + -1) {
                    *puVar16 = puVar29[lVar21 + lVar32];
                    puVar16 = puVar16 + 1;
                  }
                  for (iVar31 = 0; iVar31 != iVar17; iVar31 = iVar31 + 1) {
                    uVar2 = *puVar29;
                    puVar29 = puVar29 + 1;
                    *puVar16 = uVar2;
                    puVar16 = puVar16 + 1;
                  }
                  for (lVar32 = 0; -lVar32 != uVar15; lVar32 = lVar32 + -1) {
                    *puVar16 = puVar29[lVar32 + -2];
                    puVar16 = puVar16 + 1;
                  }
                }
                puVar26 = puVar29 + -(long)(iVar8 * 2);
                iVar31 = 0;
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                puVar29 = puVar29 + (lVar21 - iVar8 * 2);
                for (; iVar31 != iVar11; iVar31 = iVar31 + 1) {
                  for (lVar21 = 0; -lVar21 != uVar9; lVar21 = lVar21 + -1) {
                    *puVar16 = puVar29[lVar21];
                    puVar16 = puVar16 + 1;
                  }
                  puVar25 = puVar26;
                  for (iVar8 = 0; iVar8 != iVar17; iVar8 = iVar8 + 1) {
                    uVar2 = *puVar25;
                    puVar25 = puVar25 + 1;
                    *puVar16 = uVar2;
                    puVar16 = puVar16 + 1;
                  }
                  for (lVar21 = 0; -lVar21 != uVar15; lVar21 = lVar21 + -1) {
                    *puVar16 = puVar25[lVar21 + -2];
                    puVar16 = puVar16 + 1;
                  }
                  puVar26 = puVar26 + -lVar23;
                  puVar29 = puVar29 + -lVar23;
                }
              }
              else if (iVar20 == 1) {
                iVar20 = (this->super_Padding).left;
                iVar18 = 0;
                iVar17 = 0;
                if (iVar20 < 1) {
                  iVar20 = iVar17;
                }
                if (iVar8 < 1) {
                  iVar8 = iVar17;
                }
                iVar11 = (this->super_Padding).right;
                if (iVar11 < 1) {
                  iVar11 = iVar17;
                }
                iVar19 = (this->super_Padding).top;
                if (iVar19 < 1) {
                  iVar19 = iVar17;
                }
                iVar17 = (this->super_Padding).bottom;
                lVar23 = sVar1 * uVar28 * uVar13;
                for (; iVar5 = iVar20, iVar18 != iVar19; iVar18 = iVar18 + 1) {
                  while (iVar5 != 0) {
                    *puVar16 = *puVar29;
                    puVar16 = puVar16 + 1;
                    iVar5 = iVar5 + -1;
                  }
                  for (lVar21 = 0; iVar5 = iVar11, iVar8 != (int)lVar21; lVar21 = lVar21 + 1) {
                    *puVar16 = *(undefined8 *)((long)pvVar3 + lVar21 * 8 + lVar23);
                    puVar16 = puVar16 + 1;
                  }
                  while (iVar5 != 0) {
                    *puVar16 = *(undefined8 *)((long)pvVar3 + lVar21 * 8 + lVar23 + -8);
                    puVar16 = puVar16 + 1;
                    iVar5 = iVar5 + -1;
                  }
                }
                iVar8 = 0;
                if (0 < m_1.w) {
                  iVar8 = m_1.w;
                }
                iVar18 = 0;
                iVar19 = 0;
                if (0 < iVar31) {
                  iVar18 = 0;
                  iVar19 = iVar31;
                }
                for (; iVar31 = iVar20, iVar18 != iVar19; iVar18 = iVar18 + 1) {
                  while (iVar31 != 0) {
                    *puVar16 = *puVar29;
                    puVar16 = puVar16 + 1;
                    iVar31 = iVar31 + -1;
                  }
                  lVar21 = 0;
                  for (lVar23 = 0; iVar8 != (int)lVar23; lVar23 = lVar23 + 1) {
                    puVar16[lVar23] = puVar29[lVar23];
                    lVar21 = lVar21 + -8;
                  }
                  puVar16 = (undefined8 *)((long)puVar16 - lVar21);
                  iVar31 = iVar11;
                  while (bVar33 = iVar31 != 0, iVar31 = iVar31 + -1, bVar33) {
                    *puVar16 = puVar29[lVar23 + -1];
                    puVar16 = puVar16 + 1;
                  }
                  puVar29 = (undefined8 *)((long)puVar29 - lVar21);
                }
                puVar29 = puVar29 + -(long)m_1.w;
                iVar31 = 0;
                if (iVar17 < 1) {
                  iVar17 = iVar31;
                }
                for (; iVar18 = iVar20, iVar31 != iVar17; iVar31 = iVar31 + 1) {
                  while (iVar18 != 0) {
                    *puVar16 = *puVar29;
                    puVar16 = puVar16 + 1;
                    iVar18 = iVar18 + -1;
                  }
                  for (lVar23 = 0; iVar18 = iVar11, iVar8 != (int)lVar23; lVar23 = lVar23 + 1) {
                    *puVar16 = puVar29[lVar23];
                    puVar16 = puVar16 + 1;
                  }
                  while (iVar18 != 0) {
                    *puVar16 = puVar29[lVar23 + -1];
                    puVar16 = puVar16 + 1;
                    iVar18 = iVar18 + -1;
                  }
                }
              }
            }
            uVar13 = (ulong)((int)uVar13 + 1);
          }
          return 0;
        }
      }
      break;
    case 4:
      if ((this->super_Padding).type == 0) {
        uVar12 = (this->super_Padding).front + iVar8 + (this->super_Padding).behind;
        uVar13 = (ulong)uVar12;
        Mat::create(top_blob,m.w + (this->super_Padding).left + (this->super_Padding).right,
                    m.h + (this->super_Padding).top + (this->super_Padding).bottom,uVar12,uVar24,
                    m.elemsize,8,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if ((int)uVar12 < 1) {
          uVar13 = 0;
        }
        if ((int)uVar24 < 1) {
          uVar10 = 0;
        }
        for (uVar30 = 0; uVar30 != uVar10; uVar30 = uVar30 + 1) {
          uVar9 = (ulong)(this->super_Padding).value;
          uVar9 = uVar9 << 0x38 | uVar9 << 0x30 | uVar9 << 0x28 |
                  uVar9 << 0x20 | uVar9 << 0x18 | uVar9 << 0x10 | uVar9 << 8 | uVar9;
          for (uVar28 = 0; auVar34 = (undefined1  [64])m_1._0_64_, uVar28 != uVar13;
              uVar28 = uVar28 + 1) {
            m.w = top_blob->w;
            m.h = top_blob->h;
            pvVar3 = top_blob->data;
            m.elemsize = top_blob->elemsize;
            lVar23 = top_blob->cstep * uVar30;
            m.elempack = top_blob->elempack;
            m.cstep = (long)m.h * (long)m.w;
            m.data = (void *)((long)pvVar3 + uVar28 * m.elemsize * m.cstep + lVar23 * m.elemsize);
            m.allocator = top_blob->allocator;
            m.refcount = (int *)0x0;
            m.dims = 2;
            m.d = 1;
            m.c = 1;
            uVar24 = (int)uVar28 - (this->super_Padding).front;
            if ((int)uVar24 < 0 || iVar8 <= (int)uVar24) {
              uVar14 = m.cstep & 0xffffffff;
              if ((int)m.cstep < 1) {
                uVar14 = 0;
              }
              for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
                *(ulong *)((long)pvVar3 +
                          uVar15 * 8 + m.elemsize * ((long)m.h * uVar28 * (long)m.w + lVar23)) =
                     uVar9;
              }
            }
            else {
              m_1.elemsize = bottom_blob->elemsize;
              m_1.cstep = (long)bottom_blob->h * (long)bottom_blob->w;
              m_1.refcount = (int *)0x0;
              m_1.data = (void *)((long)bottom_blob->data +
                                 uVar24 * m_1.elemsize * m_1.cstep +
                                 bottom_blob->cstep * uVar30 * m_1.elemsize);
              m_1._28_36_ = auVar34._28_36_;
              m_1.elempack = bottom_blob->elempack;
              m_1.allocator = bottom_blob->allocator;
              m_1.dims = 2;
              m_1.w = bottom_blob->w;
              m_1.h = bottom_blob->h;
              m_1._60_4_ = auVar34._60_4_;
              m_1.d = 1;
              m_1.c = 1;
              padding_constant_pack8_int8_sse
                        (&m_1,&m,(this->super_Padding).top,(this->super_Padding).bottom,
                         (this->super_Padding).left,(this->super_Padding).right,uVar9);
            }
          }
        }
        return 0;
      }
    }
  }
  piVar4 = bottom_blob->refcount;
  m.data = bottom_blob->data;
  m.refcount = bottom_blob->refcount;
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  m.d = iVar8;
  m.c = uVar24;
  if (m.elempack != 1) {
    auVar34 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar34 = vmovdqu64_avx512f(auVar34);
    m_1._16_48_ = auVar34._16_48_;
    m_1.data = auVar34._0_8_;
    m_1.refcount = (int *)opt->workspace_allocator;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      iVar8 = -100;
      goto LAB_003c2bc8;
    }
  }
  iVar8 = Padding::forward(&this->super_Padding,&m,top_blob,opt);
LAB_003c2bc8:
  if (m.refcount != (int *)0x0) {
    LOCK();
    *m.refcount = *m.refcount + -1;
    UNLOCK();
    if (*m.refcount == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Padding_x86_avx512::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}